

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TableGenerator.cpp
# Opt level: O1

void ShuffleDeck16(PCGRandom *prng,uint16_t *deck,uint32_t count)

{
  uint uVar1;
  uint64_t uVar2;
  ulong uVar3;
  bool bVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  uint64_t oldstate;
  uint64_t uVar8;
  
  *deck = 0;
  uVar8 = prng->State;
  uVar2 = prng->Inc;
  if (count < 0x101) {
    uVar7 = 1;
    do {
      uVar6 = (uint)(uVar8 >> 0x2d) ^ (uint)(uVar8 >> 0x1b);
      bVar5 = (byte)(uVar8 >> 0x3b);
      uVar6 = uVar6 >> bVar5 | uVar6 << 0x20 - bVar5;
      switch(count - uVar7) {
      case 0:
        bVar4 = false;
        break;
      case 3:
        uVar3 = (ulong)(uVar6 & 0xff) % (ulong)uVar7;
        deck[uVar7] = deck[uVar3];
        deck[uVar3] = (uint16_t)uVar7;
        uVar7 = uVar7 + 1;
      case 2:
        uVar3 = (ulong)(uVar6 >> 8 & 0xff) % (ulong)uVar7;
        deck[uVar7] = deck[uVar3];
        deck[uVar3] = (uint16_t)uVar7;
        uVar7 = uVar7 + 1;
      case 1:
        uVar3 = (ulong)(uVar6 >> 0x10 & 0xff) % (ulong)uVar7;
        bVar4 = false;
        deck[uVar7] = deck[uVar3];
        deck[uVar3] = (uint16_t)uVar7;
        break;
      default:
        uVar3 = (ulong)(uVar6 & 0xff) % (ulong)uVar7;
        deck[uVar7] = deck[uVar3];
        deck[uVar3] = (uint16_t)uVar7;
        uVar1 = uVar7 + 1;
        uVar3 = (ulong)(uVar6 >> 8 & 0xff) % (ulong)uVar1;
        deck[uVar1] = deck[uVar3];
        deck[uVar3] = (uint16_t)uVar1;
        uVar1 = uVar7 + 2;
        uVar3 = (ulong)(uVar6 >> 0x10 & 0xff) % (ulong)uVar1;
        deck[uVar1] = deck[uVar3];
        deck[uVar3] = (uint16_t)uVar1;
        uVar1 = uVar7 + 3;
        uVar3 = (ulong)(uVar6 >> 0x18) % (ulong)uVar1;
        deck[uVar1] = deck[uVar3];
        deck[uVar3] = (uint16_t)uVar1;
        uVar7 = uVar7 + 4;
        bVar4 = true;
      }
      uVar8 = uVar8 * 0x5851f42d4c957f2d + uVar2;
    } while (bVar4);
  }
  else {
    uVar7 = 1;
    do {
      uVar6 = (uint)(uVar8 >> 0x2d) ^ (uint)(uVar8 >> 0x1b);
      bVar5 = (byte)(uVar8 >> 0x3b);
      uVar6 = uVar6 >> bVar5 | uVar6 << 0x20 - bVar5;
      if (count == uVar7) {
        bVar4 = false;
      }
      else if (count - uVar7 == 1) {
        bVar4 = false;
        uVar3 = (ulong)(uVar6 & 0xffff) % (ulong)uVar7;
        deck[uVar7] = deck[uVar3];
        deck[uVar3] = (uint16_t)uVar7;
      }
      else {
        uVar3 = (ulong)(uVar6 & 0xffff) % (ulong)uVar7;
        deck[uVar7] = deck[uVar3];
        deck[uVar3] = (uint16_t)uVar7;
        uVar1 = uVar7 + 1;
        uVar3 = (ulong)(uVar6 >> 0x10) % (ulong)uVar1;
        deck[uVar1] = deck[uVar3];
        deck[uVar3] = (uint16_t)uVar1;
        uVar7 = uVar7 + 2;
        bVar4 = true;
      }
      uVar8 = uVar8 * 0x5851f42d4c957f2d + uVar2;
    } while (bVar4);
  }
  prng->State = uVar8;
  return;
}

Assistant:

void ShuffleDeck16(
    PCGRandom &prng,
    uint16_t * deck,
    const uint32_t count)
{
    deck[0] = 0;

    // If we can unroll 4 times:
    if (count <= 256)
    {
        for (uint32_t ii = 1;;)
        {
            uint32_t jj, rv = prng.Next();

            // 8-bit unroll
            switch (count - ii)
            {
            default:
                jj = (uint8_t)rv % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
                jj = (uint8_t)(rv >> 8) % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
                jj = (uint8_t)(rv >> 16) % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
                jj = (uint8_t)(rv >> 24) % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
                break;

            case 3:
                jj = (uint8_t)rv % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
            case 2:
                jj = (uint8_t)(rv >> 8) % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
            case 1:
                jj = (uint8_t)(rv >> 16) % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
            case 0:
                return;
            }
        }
    }
    else
    {
        // For each deck entry:
        for (uint32_t ii = 1;;)
        {
            uint32_t jj, rv = prng.Next();

            // 16-bit unroll
            switch (count - ii)
            {
            default:
                jj = (uint16_t)rv % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
                jj = (uint16_t)(rv >> 16) % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
                ++ii;
                break;

            case 1:
                jj = (uint16_t)rv % ii;
                deck[ii] = deck[jj];
                deck[jj] = (uint16_t)ii;
            case 0:
                return;
            }
        }
    }
}